

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest_MVP_Test::InterpTest_MVP_Test(InterpTest_MVP_Test *this)

{
  Features local_28;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_00241d48;
  local_28.exceptions_enabled_ = false;
  local_28.mutable_globals_enabled_ = true;
  local_28.sat_float_to_int_enabled_ = true;
  local_28.sign_extension_enabled_ = true;
  local_28.simd_enabled_ = true;
  local_28.threads_enabled_ = false;
  local_28.function_references_enabled_ = false;
  local_28.multi_value_enabled_ = true;
  local_28.tail_call_enabled_ = false;
  local_28.bulk_memory_enabled_ = true;
  local_28.reference_types_enabled_ = true;
  local_28.annotations_enabled_ = false;
  local_28.code_metadata_enabled_ = false;
  local_28.gc_enabled_ = false;
  local_28.memory64_enabled_ = false;
  local_28.multi_memory_enabled_ = false;
  local_28.extended_const_enabled_ = false;
  local_28.relaxed_simd_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpTest).store_,&local_28);
  memset(&(this->super_InterpTest).module_desc_,0,0x150);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_00241680;
  return;
}

Assistant:

TEST_F(InterpTest, MVP) {
  // (module
  //   (type (;0;) (func (param i32) (result i32)))
  //   (type (;1;) (func (param f32) (result f32)))
  //   (type (;2;) (func))
  //   (import "foo" "bar" (func (;0;) (type 0)))
  //   (func (;1;) (type 1) (param f32) (result f32)
  //     (f32.const 0x1.5p+5 (;=42;)))
  //   (func (;2;) (type 2))
  //   (table (;0;) 1 2 funcref)
  //   (memory (;0;) 1)
  //   (global (;0;) i32 (i32.const 1))
  //   (export "quux" (func 1))
  //   (start 2)
  //   (elem (;0;) (i32.const 0) 0 1)
  //   (data (;0;) (i32.const 2) "hello"))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x0e, 0x03, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x60, 0x01, 0x7d, 0x01, 0x7d, 0x60, 0x00, 0x00,
      0x02, 0x0b, 0x01, 0x03, 0x66, 0x6f, 0x6f, 0x03, 0x62, 0x61, 0x72, 0x00,
      0x00, 0x03, 0x03, 0x02, 0x01, 0x02, 0x04, 0x05, 0x01, 0x70, 0x01, 0x01,
      0x02, 0x05, 0x03, 0x01, 0x00, 0x01, 0x06, 0x06, 0x01, 0x7f, 0x00, 0x41,
      0x01, 0x0b, 0x07, 0x08, 0x01, 0x04, 0x71, 0x75, 0x75, 0x78, 0x00, 0x01,
      0x08, 0x01, 0x02, 0x09, 0x08, 0x01, 0x00, 0x41, 0x00, 0x0b, 0x02, 0x00,
      0x01, 0x0a, 0x0c, 0x02, 0x07, 0x00, 0x43, 0x00, 0x00, 0x28, 0x42, 0x0b,
      0x02, 0x00, 0x0b, 0x0b, 0x0b, 0x01, 0x00, 0x41, 0x02, 0x0b, 0x05, 0x68,
      0x65, 0x6c, 0x6c, 0x6f,
  });

  EXPECT_EQ(3u, module_desc_.func_types.size());
  EXPECT_EQ(1u, module_desc_.imports.size());
  EXPECT_EQ(2u, module_desc_.funcs.size());
  EXPECT_EQ(1u, module_desc_.tables.size());
  EXPECT_EQ(1u, module_desc_.memories.size());
  EXPECT_EQ(1u, module_desc_.globals.size());
  EXPECT_EQ(0u, module_desc_.tags.size());
  EXPECT_EQ(1u, module_desc_.exports.size());
  EXPECT_EQ(1u, module_desc_.starts.size());
  EXPECT_EQ(1u, module_desc_.elems.size());
  EXPECT_EQ(1u, module_desc_.datas.size());
}